

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_multi_member_reference_abi_cxx11_
          (CompilerGLSL *this,SPIRType *type,SmallVector<unsigned_int,_8UL> *indices)

{
  uint32_t id;
  TypedID *this_00;
  VectorView<unsigned_int> *in_RCX;
  undefined1 local_98 [64];
  uint *local_58;
  uint *index;
  uint *__end1;
  uint *__begin1;
  SmallVector<unsigned_int,_8UL> *__range1;
  SPIRType *member_type;
  VectorView<unsigned_int> *local_28;
  SmallVector<unsigned_int,_8UL> *indices_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *ret;
  
  member_type._7_1_ = 0;
  local_28 = in_RCX;
  indices_local = indices;
  type_local = type;
  this_local = this;
  ::std::__cxx11::string::string((string *)this);
  __range1 = indices_local;
  __begin1 = (uint *)local_28;
  __end1 = VectorView<unsigned_int>::begin(local_28);
  index = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin1);
  for (; __end1 != index; __end1 = __end1 + 1) {
    local_58 = __end1;
    to_member_name_abi_cxx11_((CompilerGLSL *)local_98,type,(uint32_t)__range1);
    join<char_const(&)[2],std::__cxx11::string>
              ((spirv_cross *)(local_98 + 0x20),(char (*) [2])0x4dfd16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    ::std::__cxx11::string::operator+=((string *)this,(string *)(local_98 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_98 + 0x20));
    ::std::__cxx11::string::~string((string *)local_98);
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                         &__range1[2].stack_storage,(ulong)*local_58);
    id = TypedID::operator_cast_to_unsigned_int(this_00);
    __range1 = (SmallVector<unsigned_int,_8UL> *)
               Compiler::get<spirv_cross::SPIRType>((Compiler *)type,id);
  }
  return this;
}

Assistant:

string CompilerGLSL::to_multi_member_reference(const SPIRType &type, const SmallVector<uint32_t> &indices)
{
	string ret;
	auto *member_type = &type;
	for (auto &index : indices)
	{
		ret += join(".", to_member_name(*member_type, index));
		member_type = &get<SPIRType>(member_type->member_types[index]);
	}
	return ret;
}